

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<double,_3,_3> *
tcu::operator*(Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *a,
              Matrix<double,_3,_3> *b)

{
  int row;
  long lVar1;
  Vector<double,_3> *pVVar2;
  long lVar3;
  Vector<double,_3> *pVVar4;
  int ndx;
  long lVar5;
  double v;
  double dVar6;
  
  Matrix<double,_3,_3>::Matrix(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    pVVar2 = (Vector<double,_3> *)b;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      dVar6 = 0.0;
      pVVar4 = (Vector<double,_3> *)a;
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        dVar6 = dVar6 + ((Vector<tcu::Vector<double,_3>,_3> *)pVVar4->m_data)->m_data[0].m_data[0] *
                        ((Vector<tcu::Vector<double,_3>,_3> *)pVVar2->m_data)->m_data[0].m_data
                        [lVar5];
        pVVar4 = pVVar4 + 1;
      }
      (__return_storage_ptr__->m_data).m_data[lVar3].m_data[lVar1] = dVar6;
      pVVar2 = pVVar2 + 1;
    }
    a = (Matrix<double,_3,_3> *)(((Vector<double,_3> *)a)->m_data + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}